

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnImportEvent
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index event_index,Index sig_index)

{
  ObjdumpState *pOVar1;
  pointer pbVar2;
  size_type sVar3;
  ulong uVar4;
  _Alloc_hider _Var5;
  
  uVar4 = (ulong)event_index;
  _Var5._M_p = (pointer)0x0;
  PrintDetails(this," - event[%u] sig=%u",uVar4,(ulong)sig_index);
  pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
  pbVar2 = (pOVar1->event_names).names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar3 = 0;
  if (uVar4 < (ulong)((long)(pOVar1->event_names).names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    _Var5._M_p = pbVar2[uVar4]._M_dataplus._M_p;
    sVar3 = pbVar2[uVar4]._M_string_length;
  }
  if (sVar3 != 0) {
    PrintDetails(this," <%.*s>",sVar3,_Var5._M_p);
  }
  PrintDetails(this," <- %.*s.%.*s\n",module_name.size_ & 0xffffffff,module_name.data_,
               field_name.size_ & 0xffffffff,field_name.data_);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnImportEvent(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index event_index,
                                          Index sig_index) {
  PrintDetails(" - event[%" PRIindex "] sig=%" PRIindex, event_index,
               sig_index);
  auto name = GetEventName(event_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}